

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<3UL>::Seal(SimpleTypeHandler<3UL> *this,DynamicObject *instance)

{
  int iVar1;
  DictionaryTypeHandler *pDVar2;
  DynamicObject *instance_local;
  SimpleTypeHandler<3UL> *this_local;
  
  pDVar2 = ConvertToDictionaryType(this,instance);
  iVar1 = (*(pDVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x37])(pDVar2,instance);
  return iVar1;
}

Assistant:

BOOL SimpleTypeHandler<size>::Seal(DynamicObject* instance)
    {
        return ConvertToDictionaryType(instance)->Seal(instance);
    }